

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void av1_loop_restoration_filter_frame_mt
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int optimized_lr,AVxWorker *workers,
               int num_workers,AV1LrSync *lr_sync,void *lr_ctxt,int do_extend_border)

{
  AV1_COMMON *in_RSI;
  undefined8 in_RDI;
  AV1_COMMON *unaff_retaddr;
  AV1LrStruct *loop_rest_ctxt;
  int num_planes;
  undefined4 in_stack_00000020;
  YV12_BUFFER_CONFIG *in_stack_00000048;
  int do_extend_border_00;
  
  do_extend_border_00 = (int)((ulong)in_RDI >> 0x20);
  av1_num_planes(in_RSI);
  av1_loop_restoration_filter_frame_init
            ((AV1LrStruct *)lr_ctxt,in_stack_00000048,(AV1_COMMON *)frame,cm._4_4_,(int)cm);
  foreach_rest_unit_in_planes_mt
            ((AV1LrStruct *)CONCAT44(num_workers,in_stack_00000020),(AVxWorker *)lr_sync,num_planes,
             (AV1LrSync *)loop_rest_ctxt,unaff_retaddr,do_extend_border_00);
  return;
}

Assistant:

void av1_loop_restoration_filter_frame_mt(YV12_BUFFER_CONFIG *frame,
                                          AV1_COMMON *cm, int optimized_lr,
                                          AVxWorker *workers, int num_workers,
                                          AV1LrSync *lr_sync, void *lr_ctxt,
                                          int do_extend_border) {
  assert(!cm->features.all_lossless);

  const int num_planes = av1_num_planes(cm);

  AV1LrStruct *loop_rest_ctxt = (AV1LrStruct *)lr_ctxt;

  av1_loop_restoration_filter_frame_init(loop_rest_ctxt, frame, cm,
                                         optimized_lr, num_planes);

  foreach_rest_unit_in_planes_mt(loop_rest_ctxt, workers, num_workers, lr_sync,
                                 cm, do_extend_border);
}